

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

bool testing::internal::
     TypeParameterizedTestSuite<(anonymous_namespace)::UnsignedToString,_testing::internal::Templates<gtest_suite_UnsignedToString_::One,_gtest_suite_UnsignedToString_::Ten,_gtest_suite_UnsignedToString_::Max>,_testing::internal::Types<unsigned_char,_unsigned_int,_unsigned_long,_unsigned_long_long>_>
     ::Register(char *prefix,CodeLocation *code_location,TypedTestSuitePState *state,char *case_name
               ,char *test_names,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  _Alloc_hider _Var1;
  _Alloc_hider _Var2;
  _Alloc_hider _Var3;
  bool bVar4;
  undefined1 uVar5;
  CodeLocation *pCVar6;
  SetUpTearDownSuiteFuncType p_Var7;
  SetUpTearDownSuiteFuncType p_Var8;
  TestFactoryBase *pTVar9;
  internal *piVar10;
  int iVar11;
  char *str;
  char *str_00;
  char *str_01;
  char *str_02;
  char *str_03;
  char *str_04;
  char *str_05;
  char *str_06;
  char *str_07;
  char *str_08;
  char *str_09;
  char *str_10;
  char *str_11;
  char *str_12;
  char *str_13;
  FILE *__stream;
  string local_358;
  string local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  CodeLocation local_2f8;
  string local_2d0;
  CodeLocation *local_2b0;
  allocator local_2a1;
  string local_2a0;
  CodeLocation local_280;
  CodeLocation local_258;
  string *local_230;
  CodeLocation local_228;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string test_name;
  CodeLocation local_140;
  string local_118;
  string test_name_1;
  string test_name_2;
  CodeLocation local_b8;
  string local_90;
  string local_70;
  string local_50;
  
  iVar11 = (int)case_name;
  local_2b0 = (CodeLocation *)prefix;
  RegisterTypeParameterizedTestSuiteInstantiation("UnsignedToString");
  GetPrefixUntilComma_abi_cxx11_(&local_50,(internal *)code_location,str);
  StripTrailingSpaces(&test_name,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  bVar4 = TypedTestSuitePState::TestExists
                    (&gtest_typed_test_suite_p_state_UnsignedToString_,&test_name);
  __stream = _stderr;
  if (bVar4) {
    pCVar6 = TypedTestSuitePState::GetCodeLocation
                       (&gtest_typed_test_suite_p_state_UnsignedToString_,&test_name);
    std::__cxx11::string::string((string *)&local_318,"U2S",(allocator *)&local_2d0);
    std::operator+(&local_280.file,&local_318,"/");
    std::operator+(&local_228.file,&local_280.file,"UnsignedToString");
    std::operator+(&local_258.file,&local_228.file,"/");
    std::operator+(&local_2f8.file,&local_258.file,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)state);
    _Var3._M_p = local_2f8.file._M_dataplus._M_p;
    GetPrefixUntilComma_abi_cxx11_(&local_1c0,(internal *)code_location,str_00);
    StripTrailingSpaces(&local_338,&local_1c0);
    _Var2._M_p = local_338._M_dataplus._M_p;
    GetTypeName<unsigned_char>();
    _Var1._M_p = local_358._M_dataplus._M_p;
    CodeLocation::CodeLocation(&local_140,pCVar6);
    p_Var7 = SuiteApiResolver<gtest_suite_UnsignedToString_::One<unsigned_char>_>::
             GetSetUpCaseOrSuite((pCVar6->file)._M_dataplus._M_p,pCVar6->line);
    p_Var8 = SuiteApiResolver<gtest_suite_UnsignedToString_::One<unsigned_char>_>::
             GetTearDownCaseOrSuite((pCVar6->file)._M_dataplus._M_p,pCVar6->line);
    pTVar9 = (TestFactoryBase *)operator_new(8);
    pTVar9->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0022ab10;
    MakeAndRegisterTestInfo
              (_Var3._M_p,_Var2._M_p,_Var1._M_p,(char *)0x0,&local_140,
               &TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_char>>::dummy_,p_Var7,
               p_Var8,pTVar9);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_358);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::string::string((string *)&local_338,"U2S",(allocator *)&local_2a0);
    std::operator+(&local_318,&local_338,"/");
    std::operator+(&local_280.file,&local_318,"UnsignedToString");
    std::operator+(&local_258.file,&local_280.file,"/");
    std::operator+(&local_2f8.file,&local_258.file,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (*(long *)state + 0x20));
    _Var2._M_p = local_2f8.file._M_dataplus._M_p;
    GetPrefixUntilComma_abi_cxx11_(&local_1a0,(internal *)code_location,str_01);
    StripTrailingSpaces(&local_358,&local_1a0);
    _Var1._M_p = local_358._M_dataplus._M_p;
    GetTypeName<unsigned_int>();
    _Var3._M_p = local_2d0._M_dataplus._M_p;
    CodeLocation::CodeLocation(&local_228,pCVar6);
    p_Var7 = SuiteApiResolver<gtest_suite_UnsignedToString_::One<unsigned_int>_>::
             GetSetUpCaseOrSuite((pCVar6->file)._M_dataplus._M_p,pCVar6->line);
    p_Var8 = SuiteApiResolver<gtest_suite_UnsignedToString_::One<unsigned_int>_>::
             GetTearDownCaseOrSuite((pCVar6->file)._M_dataplus._M_p,pCVar6->line);
    pTVar9 = (TestFactoryBase *)operator_new(8);
    pTVar9->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0022aba8;
    MakeAndRegisterTestInfo
              (_Var2._M_p,_Var1._M_p,_Var3._M_p,(char *)0x0,&local_228,
               &TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_int>>::dummy_,p_Var7,
               p_Var8,pTVar9);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_358);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::string((string *)&local_358,"U2S",(allocator *)&local_200);
    std::operator+(&local_338,&local_358,"/");
    std::operator+(&local_318,&local_338,"UnsignedToString");
    std::operator+(&local_280.file,&local_318,"/");
    std::operator+(&local_2f8.file,&local_280.file,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (*(long *)state + 0x40));
    _Var1._M_p = local_2f8.file._M_dataplus._M_p;
    GetPrefixUntilComma_abi_cxx11_(&local_180,(internal *)code_location,str_02);
    StripTrailingSpaces(&local_2d0,&local_180);
    _Var2._M_p = local_2d0._M_dataplus._M_p;
    GetTypeName<unsigned_long>();
    _Var3._M_p = local_2a0._M_dataplus._M_p;
    CodeLocation::CodeLocation(&local_258,pCVar6);
    p_Var7 = SuiteApiResolver<gtest_suite_UnsignedToString_::One<unsigned_long>_>::
             GetSetUpCaseOrSuite((pCVar6->file)._M_dataplus._M_p,pCVar6->line);
    p_Var8 = SuiteApiResolver<gtest_suite_UnsignedToString_::One<unsigned_long>_>::
             GetTearDownCaseOrSuite((pCVar6->file)._M_dataplus._M_p,pCVar6->line);
    pTVar9 = (TestFactoryBase *)operator_new(8);
    pTVar9->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0022ac40;
    MakeAndRegisterTestInfo
              (_Var1._M_p,_Var2._M_p,_Var3._M_p,(char *)0x0,&local_258,
               &TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_long>>::dummy_,p_Var7,
               p_Var8,pTVar9);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::~string((string *)&local_358);
    std::__cxx11::string::string((string *)&local_2d0,"U2S",(allocator *)&local_118);
    std::operator+(&local_358,&local_2d0,"/");
    std::operator+(&local_338,&local_358,"UnsignedToString");
    std::operator+(&local_318,&local_338,"/");
    std::operator+(&local_280.file,&local_318,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (*(long *)state + 0x60));
    _Var2._M_p = local_280.file._M_dataplus._M_p;
    GetPrefixUntilComma_abi_cxx11_(&local_200,(internal *)code_location,str_03);
    StripTrailingSpaces(&local_2a0,&local_200);
    _Var1._M_p = local_2a0._M_dataplus._M_p;
    GetTypeName<unsigned_long_long>();
    _Var3._M_p = local_1e0._M_dataplus._M_p;
    CodeLocation::CodeLocation(&local_2f8,pCVar6);
    p_Var7 = SuiteApiResolver<gtest_suite_UnsignedToString_::One<unsigned_long_long>_>::
             GetSetUpCaseOrSuite((pCVar6->file)._M_dataplus._M_p,pCVar6->line);
    p_Var8 = SuiteApiResolver<gtest_suite_UnsignedToString_::One<unsigned_long_long>_>::
             GetTearDownCaseOrSuite((pCVar6->file)._M_dataplus._M_p,pCVar6->line);
    pTVar9 = (TestFactoryBase *)operator_new(8);
    pTVar9->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0022acd8;
    iVar11 = 0;
    MakeAndRegisterTestInfo
              (_Var2._M_p,_Var1._M_p,_Var3._M_p,(char *)0x0,&local_2f8,
               &TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_long_long>>::dummy_,
               p_Var7,p_Var8,pTVar9);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::~string((string *)&local_358);
    std::__cxx11::string::~string((string *)&local_2d0);
    CodeLocation::CodeLocation(&local_b8,local_2b0);
    piVar10 = (internal *)SkipComma((char *)code_location);
    RegisterTypeParameterizedTestSuiteInstantiation("UnsignedToString");
    GetPrefixUntilComma_abi_cxx11_(&local_90,piVar10,str_04);
    StripTrailingSpaces(&test_name_1,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    bVar4 = TypedTestSuitePState::TestExists
                      (&gtest_typed_test_suite_p_state_UnsignedToString_,&test_name_1);
    __stream = _stderr;
    if (bVar4) {
      local_2b0 = (CodeLocation *)&test_name_1;
      pCVar6 = TypedTestSuitePState::GetCodeLocation
                         (&gtest_typed_test_suite_p_state_UnsignedToString_,(string *)local_2b0);
      std::__cxx11::string::string((string *)&local_318,"U2S",(allocator *)&local_2d0);
      std::operator+(&local_280.file,&local_318,"/");
      std::operator+(&local_228.file,&local_280.file,"UnsignedToString");
      std::operator+(&local_258.file,&local_228.file,"/");
      std::operator+(&local_2f8.file,&local_258.file,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)state);
      _Var2._M_p = local_2f8.file._M_dataplus._M_p;
      GetPrefixUntilComma_abi_cxx11_(&local_1c0,piVar10,str_05);
      StripTrailingSpaces(&local_338,&local_1c0);
      GetTypeName<unsigned_char>();
      _Var1._M_p = local_358._M_dataplus._M_p;
      CodeLocation::CodeLocation(&local_140,pCVar6);
      p_Var7 = SuiteApiResolver<gtest_suite_UnsignedToString_::Ten<unsigned_char>_>::
               GetSetUpCaseOrSuite((pCVar6->file)._M_dataplus._M_p,pCVar6->line);
      p_Var8 = SuiteApiResolver<gtest_suite_UnsignedToString_::Ten<unsigned_char>_>::
               GetTearDownCaseOrSuite((pCVar6->file)._M_dataplus._M_p,pCVar6->line);
      pTVar9 = (TestFactoryBase *)operator_new(8);
      pTVar9->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0022ad70;
      MakeAndRegisterTestInfo
                (_Var2._M_p,local_338._M_dataplus._M_p,_Var1._M_p,(char *)0x0,&local_140,
                 &TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_char>>::dummy_,
                 p_Var7,p_Var8,pTVar9);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_358);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::string((string *)&local_338,"U2S",(allocator *)&local_2a0);
      std::operator+(&local_318,&local_338,"/");
      std::operator+(&local_280.file,&local_318,"UnsignedToString");
      std::operator+(&local_258.file,&local_280.file,"/");
      std::operator+(&local_2f8.file,&local_258.file,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (*(long *)state + 0x20));
      _Var2._M_p = local_2f8.file._M_dataplus._M_p;
      GetPrefixUntilComma_abi_cxx11_(&local_1a0,piVar10,str_06);
      StripTrailingSpaces(&local_358,&local_1a0);
      _Var1._M_p = local_358._M_dataplus._M_p;
      GetTypeName<unsigned_int>();
      _Var3._M_p = local_2d0._M_dataplus._M_p;
      CodeLocation::CodeLocation(&local_228,pCVar6);
      p_Var7 = SuiteApiResolver<gtest_suite_UnsignedToString_::Ten<unsigned_int>_>::
               GetSetUpCaseOrSuite((pCVar6->file)._M_dataplus._M_p,pCVar6->line);
      p_Var8 = SuiteApiResolver<gtest_suite_UnsignedToString_::Ten<unsigned_int>_>::
               GetTearDownCaseOrSuite((pCVar6->file)._M_dataplus._M_p,pCVar6->line);
      pTVar9 = (TestFactoryBase *)operator_new(8);
      pTVar9->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0022ae08;
      MakeAndRegisterTestInfo
                (_Var2._M_p,_Var1._M_p,_Var3._M_p,(char *)0x0,&local_228,
                 &TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_int>>::dummy_,p_Var7
                 ,p_Var8,pTVar9);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_358);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::string::string((string *)&local_358,"U2S",(allocator *)&local_200);
      std::operator+(&local_338,&local_358,"/");
      std::operator+(&local_318,&local_338,"UnsignedToString");
      std::operator+(&local_280.file,&local_318,"/");
      std::operator+(&local_2f8.file,&local_280.file,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (*(long *)state + 0x40));
      _Var1._M_p = local_2f8.file._M_dataplus._M_p;
      GetPrefixUntilComma_abi_cxx11_(&local_180,piVar10,str_07);
      StripTrailingSpaces(&local_2d0,&local_180);
      _Var2._M_p = local_2d0._M_dataplus._M_p;
      GetTypeName<unsigned_long>();
      _Var3._M_p = local_2a0._M_dataplus._M_p;
      CodeLocation::CodeLocation(&local_258,pCVar6);
      p_Var7 = SuiteApiResolver<gtest_suite_UnsignedToString_::Ten<unsigned_long>_>::
               GetSetUpCaseOrSuite((pCVar6->file)._M_dataplus._M_p,pCVar6->line);
      p_Var8 = SuiteApiResolver<gtest_suite_UnsignedToString_::Ten<unsigned_long>_>::
               GetTearDownCaseOrSuite((pCVar6->file)._M_dataplus._M_p,pCVar6->line);
      pTVar9 = (TestFactoryBase *)operator_new(8);
      pTVar9->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0022aea0;
      MakeAndRegisterTestInfo
                (_Var1._M_p,_Var2._M_p,_Var3._M_p,(char *)0x0,&local_258,
                 &TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_long>>::dummy_,
                 p_Var7,p_Var8,pTVar9);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::string::~string((string *)&local_358);
      std::__cxx11::string::string((string *)&local_2d0,"U2S",(allocator *)&local_118);
      std::operator+(&local_358,&local_2d0,"/");
      std::operator+(&local_338,&local_358,"UnsignedToString");
      std::operator+(&local_318,&local_338,"/");
      std::operator+(&local_280.file,&local_318,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (*(long *)state + 0x60));
      _Var2._M_p = local_280.file._M_dataplus._M_p;
      GetPrefixUntilComma_abi_cxx11_(&local_200,piVar10,str_08);
      StripTrailingSpaces(&local_2a0,&local_200);
      _Var1._M_p = local_2a0._M_dataplus._M_p;
      GetTypeName<unsigned_long_long>();
      CodeLocation::CodeLocation(&local_2f8,pCVar6);
      p_Var7 = SuiteApiResolver<gtest_suite_UnsignedToString_::Ten<unsigned_long_long>_>::
               GetSetUpCaseOrSuite((pCVar6->file)._M_dataplus._M_p,pCVar6->line);
      p_Var8 = SuiteApiResolver<gtest_suite_UnsignedToString_::Ten<unsigned_long_long>_>::
               GetTearDownCaseOrSuite((pCVar6->file)._M_dataplus._M_p,pCVar6->line);
      pTVar9 = (TestFactoryBase *)operator_new(8);
      pTVar9->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0022af38;
      iVar11 = 0;
      MakeAndRegisterTestInfo
                (_Var2._M_p,_Var1._M_p,local_1e0._M_dataplus._M_p,(char *)0x0,&local_2f8,
                 &TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_long_long>>::dummy_,
                 p_Var7,p_Var8,pTVar9);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::string::~string((string *)&local_358);
      std::__cxx11::string::~string((string *)&local_2d0);
      CodeLocation::CodeLocation(&local_280,&local_b8);
      piVar10 = (internal *)SkipComma((char *)piVar10);
      RegisterTypeParameterizedTestSuiteInstantiation("UnsignedToString");
      GetPrefixUntilComma_abi_cxx11_(&local_70,piVar10,str_09);
      StripTrailingSpaces(&test_name_2,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      bVar4 = TypedTestSuitePState::TestExists
                        (&gtest_typed_test_suite_p_state_UnsignedToString_,&test_name_2);
      __stream = _stderr;
      if (bVar4) {
        local_230 = &test_name_2;
        pCVar6 = TypedTestSuitePState::GetCodeLocation
                           (&gtest_typed_test_suite_p_state_UnsignedToString_,local_230);
        std::__cxx11::string::string((string *)&local_338,"U2S",(allocator *)&local_2a0);
        std::operator+(&local_318,&local_338,"/");
        std::operator+(&local_228.file,&local_318,"UnsignedToString");
        std::operator+(&local_258.file,&local_228.file,"/");
        std::operator+(&local_2f8.file,&local_258.file,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)state)
        ;
        _Var1._M_p = local_2f8.file._M_dataplus._M_p;
        GetPrefixUntilComma_abi_cxx11_(&local_118,piVar10,str_10);
        StripTrailingSpaces(&local_358,&local_118);
        GetTypeName<unsigned_char>();
        _Var2._M_p = local_2d0._M_dataplus._M_p;
        CodeLocation::CodeLocation(&local_140,pCVar6);
        p_Var7 = SuiteApiResolver<gtest_suite_UnsignedToString_::Max<unsigned_char>_>::
                 GetSetUpCaseOrSuite((pCVar6->file)._M_dataplus._M_p,pCVar6->line);
        p_Var8 = SuiteApiResolver<gtest_suite_UnsignedToString_::Max<unsigned_char>_>::
                 GetTearDownCaseOrSuite((pCVar6->file)._M_dataplus._M_p,pCVar6->line);
        pTVar9 = (TestFactoryBase *)operator_new(8);
        pTVar9->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0022afd0;
        MakeAndRegisterTestInfo
                  (_Var1._M_p,local_358._M_dataplus._M_p,_Var2._M_p,(char *)0x0,&local_140,
                   &TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_char>>::dummy_,
                   p_Var7,p_Var8,pTVar9);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::__cxx11::string::~string((string *)&local_258);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)&local_318);
        std::__cxx11::string::~string((string *)&local_338);
        std::__cxx11::string::string((string *)&local_358,"U2S",(allocator *)&local_200);
        std::operator+(&local_338,&local_358,"/");
        std::operator+(&local_318,&local_338,"UnsignedToString");
        std::operator+(&local_258.file,&local_318,"/");
        std::operator+(&local_2f8.file,&local_258.file,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)state + 0x20));
        _Var1._M_p = local_2f8.file._M_dataplus._M_p;
        GetPrefixUntilComma_abi_cxx11_(&local_1c0,piVar10,str_11);
        StripTrailingSpaces(&local_2d0,&local_1c0);
        GetTypeName<unsigned_int>();
        _Var2._M_p = local_2a0._M_dataplus._M_p;
        CodeLocation::CodeLocation(&local_228,pCVar6);
        p_Var7 = SuiteApiResolver<gtest_suite_UnsignedToString_::Max<unsigned_int>_>::
                 GetSetUpCaseOrSuite((pCVar6->file)._M_dataplus._M_p,pCVar6->line);
        p_Var8 = SuiteApiResolver<gtest_suite_UnsignedToString_::Max<unsigned_int>_>::
                 GetTearDownCaseOrSuite((pCVar6->file)._M_dataplus._M_p,pCVar6->line);
        pTVar9 = (TestFactoryBase *)operator_new(8);
        pTVar9->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0022b068;
        MakeAndRegisterTestInfo
                  (_Var1._M_p,local_2d0._M_dataplus._M_p,_Var2._M_p,(char *)0x0,&local_228,
                   &TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_int>>::dummy_,
                   p_Var7,p_Var8,pTVar9);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)&local_2a0);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::__cxx11::string::~string((string *)&local_258);
        std::__cxx11::string::~string((string *)&local_318);
        std::__cxx11::string::~string((string *)&local_338);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::string::string((string *)&local_2d0,"U2S",(allocator *)&local_1e0);
        std::operator+(&local_358,&local_2d0,"/");
        std::operator+(&local_338,&local_358,"UnsignedToString");
        std::operator+(&local_318,&local_338,"/");
        std::operator+(&local_2f8.file,&local_318,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)state + 0x40));
        GetPrefixUntilComma_abi_cxx11_(&local_1a0,piVar10,str_12);
        StripTrailingSpaces(&local_2a0,&local_1a0);
        GetTypeName<unsigned_long>();
        _Var1._M_p = local_200._M_dataplus._M_p;
        CodeLocation::CodeLocation(&local_258,pCVar6);
        p_Var7 = SuiteApiResolver<gtest_suite_UnsignedToString_::Max<unsigned_long>_>::
                 GetSetUpCaseOrSuite((pCVar6->file)._M_dataplus._M_p,pCVar6->line);
        p_Var8 = SuiteApiResolver<gtest_suite_UnsignedToString_::Max<unsigned_long>_>::
                 GetTearDownCaseOrSuite((pCVar6->file)._M_dataplus._M_p,pCVar6->line);
        pTVar9 = (TestFactoryBase *)operator_new(8);
        pTVar9->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0022b100;
        MakeAndRegisterTestInfo
                  (local_2f8.file._M_dataplus._M_p,local_2a0._M_dataplus._M_p,_Var1._M_p,(char *)0x0
                   ,&local_258,
                   &TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_long>>::dummy_,
                   p_Var7,p_Var8,pTVar9);
        std::__cxx11::string::~string((string *)&local_258);
        std::__cxx11::string::~string((string *)&local_200);
        std::__cxx11::string::~string((string *)&local_2a0);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::__cxx11::string::~string((string *)&local_318);
        std::__cxx11::string::~string((string *)&local_338);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::__cxx11::string::string((string *)&local_2a0,"U2S",&local_2a1);
        std::operator+(&local_2d0,&local_2a0,"/");
        std::operator+(&local_358,&local_2d0,"UnsignedToString");
        std::operator+(&local_338,&local_358,"/");
        std::operator+(&local_318,&local_338,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)state + 0x60));
        GetPrefixUntilComma_abi_cxx11_(&local_1e0,piVar10,str_13);
        StripTrailingSpaces(&local_200,&local_1e0);
        GetTypeName<unsigned_long_long>();
        CodeLocation::CodeLocation(&local_2f8,pCVar6);
        p_Var7 = SuiteApiResolver<gtest_suite_UnsignedToString_::Max<unsigned_long_long>_>::
                 GetSetUpCaseOrSuite((pCVar6->file)._M_dataplus._M_p,pCVar6->line);
        p_Var8 = SuiteApiResolver<gtest_suite_UnsignedToString_::Max<unsigned_long_long>_>::
                 GetTearDownCaseOrSuite((pCVar6->file)._M_dataplus._M_p,pCVar6->line);
        pTVar9 = (TestFactoryBase *)operator_new(8);
        pTVar9->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0022b198;
        MakeAndRegisterTestInfo
                  (local_318._M_dataplus._M_p,local_200._M_dataplus._M_p,local_180._M_dataplus._M_p,
                   (char *)0x0,&local_2f8,
                   &TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_long_long>>::
                    dummy_,p_Var7,p_Var8,pTVar9);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::~string((string *)&local_200);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::__cxx11::string::~string((string *)&local_318);
        std::__cxx11::string::~string((string *)&local_338);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::__cxx11::string::~string((string *)&local_2a0);
        SkipComma((char *)piVar10);
        std::__cxx11::string::~string((string *)&test_name_2);
        std::__cxx11::string::~string((string *)&local_280);
        std::__cxx11::string::~string((string *)&test_name_1);
        std::__cxx11::string::~string((string *)&local_b8);
        uVar5 = std::__cxx11::string::~string((string *)&test_name);
        return (bool)uVar5;
      }
      local_230 = &test_name_2;
      FormatFileLocation_abi_cxx11_
                (&local_2f8.file,(internal *)local_280.file._M_dataplus._M_p,
                 (char *)(ulong)(uint)local_280.line,iVar11);
    }
    else {
      local_2b0 = (CodeLocation *)&test_name_1;
      FormatFileLocation_abi_cxx11_
                (&local_2f8.file,(internal *)local_b8.file._M_dataplus._M_p,
                 (char *)(ulong)(uint)local_b8.line,iVar11);
      test_name_2._M_dataplus = test_name_1._M_dataplus;
    }
  }
  else {
    FormatFileLocation_abi_cxx11_
              (&local_2f8.file,(internal *)(local_2b0->file)._M_dataplus._M_p,
               (char *)(ulong)(uint)local_2b0->line,iVar11);
    test_name_2._M_dataplus = test_name._M_dataplus;
  }
  fprintf(__stream,"Failed to get code location for test %s.%s at %s.","UnsignedToString",
          test_name_2._M_dataplus._M_p,local_2f8.file._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_2f8);
  fflush(_stderr);
  posix::Abort();
}

Assistant:

static bool Register(const char* prefix, CodeLocation code_location,
                       const TypedTestSuitePState* state, const char* case_name,
                       const char* test_names,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    RegisterTypeParameterizedTestSuiteInstantiation(case_name);
    std::string test_name = StripTrailingSpaces(
        GetPrefixUntilComma(test_names));
    if (!state->TestExists(test_name)) {
      fprintf(stderr, "Failed to get code location for test %s.%s at %s.",
              case_name, test_name.c_str(),
              FormatFileLocation(code_location.file.c_str(),
                                 code_location.line).c_str());
      fflush(stderr);
      posix::Abort();
    }
    const CodeLocation& test_location = state->GetCodeLocation(test_name);

    typedef typename Tests::Head Head;

    // First, register the first test in 'Test' for each type in 'Types'.
    TypeParameterizedTest<Fixture, Head, Types>::Register(
        prefix, test_location, case_name, test_names, 0, type_names);

    // Next, recurses (at compile time) with the tail of the test list.
    return TypeParameterizedTestSuite<Fixture, typename Tests::Tail,
                                      Types>::Register(prefix, code_location,
                                                       state, case_name,
                                                       SkipComma(test_names),
                                                       type_names);
  }